

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

unique_ptr<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>_>
pbrt::SimplePathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool sampleLights;
  bool sampleBSDF;
  string local_68;
  int maxDepth;
  FileLoc *local_40;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_38;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  local_40 = loc;
  local_38 = lights;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"maxdepth","");
  maxDepth = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&local_68,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"samplelights","");
  sampleLights = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"samplebsdf","");
  sampleBSDF = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  make_unique<pbrt::SimplePathIntegrator,int&,bool&,bool&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&>
            ((int *)parameters,(bool *)&maxDepth,&sampleLights,(CameraHandle *)&sampleBSDF,sampler,
             aggregate,local_38);
  return (__uniq_ptr_data<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>,_true,_true>
            )parameters;
}

Assistant:

std::unique_ptr<SimplePathIntegrator> SimplePathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool sampleLights = parameters.GetOneBool("samplelights", true);
    bool sampleBSDF = parameters.GetOneBool("samplebsdf", true);
    return std::make_unique<SimplePathIntegrator>(maxDepth, sampleLights, sampleBSDF,
                                                  camera, sampler, aggregate, lights);
}